

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

int div64(uint64_t *plow,uint64_t *phigh,uint64_t b)

{
  ulong uVar1;
  int local_50;
  int ab;
  int qb;
  int i;
  uint64_t a0;
  uint64_t a1;
  uint64_t r;
  uint64_t q;
  uint64_t b_local;
  uint64_t *phigh_local;
  uint64_t *plow_local;
  
  _qb = *plow;
  a0 = *phigh;
  if (a0 == 0) {
    *plow = _qb / b;
    *phigh = _qb % b;
  }
  else {
    if (b <= a0) {
      return 1;
    }
    for (ab = 0; ab < 0x40; ab = ab + 1) {
      uVar1 = a0 << 1 | _qb >> 0x3f;
      if (((long)a0 < 0) || (b <= uVar1)) {
        local_50 = 1;
        a0 = uVar1 - b;
      }
      else {
        local_50 = 0;
        a0 = uVar1;
      }
      _qb = _qb << 1 | (long)local_50;
    }
    *plow = _qb;
    *phigh = a0;
  }
  return 0;
}

Assistant:

static int div64(uint64_t *plow, uint64_t *phigh, uint64_t b)
{
    uint64_t q, r, a1, a0;
    int i, qb, ab;

    a0 = *plow;
    a1 = *phigh;
    if (a1 == 0) {
        q = a0 / b;
        r = a0 % b;
        *plow = q;
        *phigh = r;
    } else {
        if (a1 >= b) {
            return 1;
        }
        /* XXX: use a better algorithm */
        for (i = 0; i < 64; i++) {
            ab = a1 >> 63;
            a1 = (a1 << 1) | (a0 >> 63);
            if (ab || a1 >= b) {
                a1 -= b;
                qb = 1;
            } else {
                qb = 0;
            }
            a0 = (a0 << 1) | qb;
        }
#if defined(DEBUG_MULDIV)
        printf("div: 0x%016" PRIx64 "%016" PRIx64 " / 0x%016" PRIx64
               ": q=0x%016" PRIx64 " r=0x%016" PRIx64 "\n",
               *phigh, *plow, b, a0, a1);
#endif
        *plow = a0;
        *phigh = a1;
    }
    return 0;
}